

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

string * cmGraphVizWriter::PathSafeString(string *__return_storage_ptr__,string *str)

{
  initializer_list<char> __l;
  bool bVar1;
  int iVar2;
  reference pcVar3;
  bool local_c1;
  _Self local_a8;
  _Self local_a0;
  char local_91;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_90;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  allocator_type local_65;
  less<char> local_64;
  char local_63 [3];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  set<char,_std::less<char>,_std::allocator<char>_> extra_chars;
  string *str_local;
  string *pathSafeStr;
  
  extra_chars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_63[0] = '.';
  local_63[1] = 0x2d;
  local_63[2] = 0x5f;
  local_60 = local_63;
  local_58 = 3;
  std::allocator<char>::allocator();
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50,__l,&local_64,&local_65);
  std::allocator<char>::~allocator(&local_65);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_90._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff70), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_91 = *pcVar3;
    iVar2 = isalnum((int)local_91);
    local_c1 = true;
    if (iVar2 == 0) {
      local_a0._M_node =
           (_Base_ptr)
           std::set<char,_std::less<char>,_std::allocator<char>_>::find
                     ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50,&local_91);
      local_a8._M_node =
           (_Base_ptr)
           std::set<char,_std::less<char>,_std::allocator<char>_>::cend
                     ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50);
      local_c1 = std::operator!=(&local_a0,&local_a8);
    }
    if (local_c1 != false) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_91);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  extra_chars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50);
  if ((extra_chars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGraphVizWriter::PathSafeString(std::string const& str)
{
  std::string pathSafeStr;

  // We'll only keep alphanumerical characters, plus the following ones that
  // are common, and safe on all platforms:
  auto const extra_chars = std::set<char>{ '.', '-', '_' };

  for (char c : str) {
    if (std::isalnum(c) || extra_chars.find(c) != extra_chars.cend()) {
      pathSafeStr += c;
    }
  }

  return pathSafeStr;
}